

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<iutest::floating_point<long_double>,iutest::floating_point<long_double>>
          (string *__return_storage_ptr__,internal *this,floating_point<long_double> *value,
          floating_point<long_double> *param_2)

{
  floating_point<long_double> *param_1_local;
  floating_point<long_double> *value_local;
  
  PrintToString<iutest::floating_point<long_double>>(__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}